

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O3

long __thiscall DivideTest<long>::random_denominator(DivideTest<long> *this)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar3 = this->seed * 0x19660d + 0x3c6ef35f;
  this->seed = uVar3;
  uVar1 = this->rand_n;
  uVar2 = ((uVar3 & 1) + 1) * uVar1 + 3 + uVar1 % 0x1c9c381;
  uVar4 = (ulong)(uVar3 % 0x13);
  if (uVar1 <= uVar2) {
    uVar4 = uVar2;
  }
  this->rand_n = uVar4;
  uVar2 = -uVar4;
  if ((uVar3 & 1) == 0) {
    uVar2 = uVar4;
  }
  if (uVar2 != 0) {
    return uVar2;
  }
  do {
    uVar3 = uVar3 * 0x19660d + 0x3c6ef35f;
    uVar2 = ((uVar3 & 1) + 1) * uVar4 + 3 + uVar4 % 0x1c9c381;
    bVar5 = uVar4 <= uVar2;
    uVar4 = (ulong)(uVar3 % 0x13);
    if (bVar5) {
      uVar4 = uVar2;
    }
    uVar2 = -uVar4;
    if ((uVar3 & 1) == 0) {
      uVar2 = uVar4;
    }
  } while (uVar2 == 0);
  this->seed = uVar3;
  this->rand_n = uVar4;
  return uVar2;
}

Assistant:

T get_random() {
        // https://en.wikipedia.org/wiki/Linear_congruential_generator
        seed = seed * 1664525 + 1013904223;

        UT old = rand_n;
        rand_n = rand_n * (seed % 2 + 1) + rand_n % 30000001 + 3;

        // Reset upon integer overflow
        if (rand_n < old) {
            rand_n = seed % 19;
        }

        // The algorithm above generates mostly positive numbers.
        // Hence convert 50% of all values to negative.
        if (limits::is_signed) {
            if (seed % 2) return -(T)rand_n;
        }

        return (T)rand_n;
    }